

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlslangToSpv.cpp
# Opt level: O0

int __thiscall
anon_unknown.dwarf_889438::TGlslangToSpvTraverser::getMatrixStride
          (TGlslangToSpvTraverser *this,TType *matrixType,TLayoutPacking explicitLayout,
          TLayoutMatrix matrixLayout)

{
  int local_c0;
  int local_bc;
  int stride;
  int size;
  TType elementType;
  TLayoutMatrix matrixLayout_local;
  TLayoutPacking explicitLayout_local;
  TType *matrixType_local;
  TGlslangToSpvTraverser *this_local;
  
  elementType.spirvType._0_4_ = matrixLayout;
  elementType.spirvType._4_4_ = explicitLayout;
  glslang::TType::TType((TType *)&stride,EbtVoid,EvqTemporary,1,0,0,false);
  glslang::TType::shallowCopy((TType *)&stride,matrixType);
  glslang::TType::clearArraySizes((TType *)&stride);
  glslang::TIntermediate::getMemberAlignment
            ((TType *)&stride,&local_bc,&local_c0,elementType.spirvType._4_4_,
             (TLayoutMatrix)elementType.spirvType == ElmRowMajor);
  glslang::TType::~TType((TType *)&stride);
  return local_c0;
}

Assistant:

int TGlslangToSpvTraverser::getMatrixStride(const glslang::TType& matrixType, glslang::TLayoutPacking explicitLayout,
    glslang::TLayoutMatrix matrixLayout)
{
    glslang::TType elementType;
    elementType.shallowCopy(matrixType);
    elementType.clearArraySizes();

    int size;
    int stride;
    glslangIntermediate->getMemberAlignment(elementType, size, stride, explicitLayout,
        matrixLayout == glslang::ElmRowMajor);

    return stride;
}